

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

bool_t strIsAlphanumeric(char *str)

{
  byte bVar1;
  
  do {
    bVar1 = *str;
    if (bVar1 == 0) {
      return 1;
    }
    str = (char *)((byte *)str + 1);
  } while ((0xf5 < (byte)(bVar1 - 0x3a)) || (0xe5 < (byte)((bVar1 & 0xdf) + 0xa5)));
  return 0;
}

Assistant:

bool_t strIsAlphanumeric(const char* str)
{
	ASSERT(strIsValid(str));
	for (; *str; ++str)
		if ((*str < '0' || *str > '9') &&
			(*str < 'A' || *str > 'Z') &&
			(*str < 'a' || *str > 'z'))
			return FALSE;
	return TRUE;
}